

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
::call(cni_helper<cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
       *this,vector *args)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  vector *in_RSI;
  proxy *in_RDI;
  string *in_stack_fffffffffffffef8;
  runtime_error *in_stack_ffffffffffffff00;
  cni_helper<cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&),_cs_impl::any_(*)(std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_&)>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 1) {
    uVar2 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff38);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff00);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff38);
    std::operator+(in_stack_ffffffffffffff38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffff30));
    cs::runtime_error::runtime_error(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __cxa_throw(__lhs,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  _call<0>(in_stack_ffffffffffffff28,in_RSI,(sequence<0> *)in_RDI);
  return_to_cs<cs_impl::any>((any *)in_stack_fffffffffffffef8);
  any::~any((any *)0x4ab7b9);
  return (any)in_RDI;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}